

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_flush_container_mt(cram_fd *fd,cram_container *c)

{
  t_pool *p;
  int iVar1;
  undefined8 *arg;
  
  p = fd->pool;
  if (p == (t_pool *)0x0) {
    iVar1 = cram_flush_container(fd,c);
    return iVar1;
  }
  arg = (undefined8 *)malloc(0x10);
  if (arg != (undefined8 *)0x0) {
    *arg = fd;
    arg[1] = c;
    t_pool_dispatch(p,fd->rqueue,cram_flush_thread,arg);
    iVar1 = cram_flush_result(fd);
    return iVar1;
  }
  return -1;
}

Assistant:

int cram_flush_container_mt(cram_fd *fd, cram_container *c) {
    cram_job *j;

    if (!fd->pool)
	return cram_flush_container(fd, c);

    if (!(j = malloc(sizeof(*j))))
	return -1;
    j->fd = fd;
    j->c = c;
    
    t_pool_dispatch(fd->pool, fd->rqueue, cram_flush_thread, j);

    return cram_flush_result(fd);
}